

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void super_stats(int nsuper,int *xsup)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int i;
  uint uVar5;
  float fVar6;
  int bucket [10];
  
  lVar1 = 0;
  uVar5 = 0;
  uVar4 = 0;
  while (lVar1 <= nsuper) {
    uVar2 = xsup[lVar1 + 1] - xsup[lVar1];
    lVar1 = lVar1 + 1;
    uVar5 = uVar5 + (uVar2 == 1);
    if ((int)uVar4 <= (int)uVar2) {
      uVar4 = uVar2;
    }
  }
  printf("    Supernode statistics:\n\tno of super = %d\n",(ulong)(nsuper + 1));
  printf("\tmax supernode size = %d\n",(ulong)uVar4);
  printf("\tno of size 1 supernodes = %d\n",(ulong)uVar5);
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    bucket[lVar1] = 0;
  }
  fVar6 = (float)(int)uVar4;
  for (lVar1 = 0; lVar1 <= nsuper; lVar1 = lVar1 + 1) {
    iVar3 = (int)(((float)(xsup[lVar1 + 1] - xsup[lVar1]) / fVar6) * 10.0);
    if (8 < iVar3) {
      iVar3 = 9;
    }
    bucket[iVar3] = bucket[iVar3] + 1;
  }
  puts("\tHistogram of supernode sizes:");
  lVar1 = 0;
  while (lVar1 != 10) {
    printf("\tsnode: %d-%d\t\t%d\n",(ulong)((int)(((float)(int)lVar1 * fVar6) / 10.0) + 1),
           (ulong)(uint)(int)(((float)(int)(lVar1 + 1) * fVar6) / 10.0),(ulong)(uint)bucket[lVar1]);
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

void super_stats(int nsuper, const int *xsup)
{
    register int nsup1 = 0;
    int    i, isize, whichb, bl, bh;
    int    bucket[NBUCKS];
    int    max_sup_size = 0;

    for (i = 0; i <= nsuper; i++) {
	isize = xsup[i+1] - xsup[i];
	if ( isize == 1 ) nsup1++;
	if ( max_sup_size < isize ) max_sup_size = isize;	
    }

    printf("    Supernode statistics:\n\tno of super = %d\n", nsuper+1);
    printf("\tmax supernode size = %d\n", max_sup_size);
    printf("\tno of size 1 supernodes = %d\n", nsup1);

    /* Histogram of the supernode sizes */
    ifill (bucket, NBUCKS, 0);

    for (i = 0; i <= nsuper; i++) {
        isize = xsup[i+1] - xsup[i];
        whichb = (float) isize / max_sup_size * NBUCKS;
        if (whichb >= NBUCKS) whichb = NBUCKS - 1;
        bucket[whichb]++;
    }
    
    printf("\tHistogram of supernode sizes:\n");
    for (i = 0; i < NBUCKS; i++) {
        bl = (float) i * max_sup_size / NBUCKS;
        bh = (float) (i+1) * max_sup_size / NBUCKS;
        printf("\tsnode: %d-%d\t\t%d\n", bl+1, bh, bucket[i]);
    }

}